

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dcm-bias-estimation.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  
  iVar1 = testUnidimDcmBiasEstimator(2);
  if (iVar1 == 0) {
    iVar1 = testDcmBiasEstimator(3);
    if (iVar1 == 0) {
      plVar2 = &std::cout;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Succeeded",9);
      iVar1 = 0;
      goto LAB_001079ec;
    }
    pcVar4 = "Failed, testDcmBiasEstimator error code: ";
    lVar3 = 0x29;
  }
  else {
    pcVar4 = "Failed, testUnidimDcmBiasEstimator error code: ";
    lVar3 = 0x2f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
LAB_001079ec:
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return iVar1;
}

Assistant:

int main()
{
  int exitCode;

  exitCode = testUnidimDcmBiasEstimator(2);

  if(exitCode != 0)
  {
    std::cout << "Failed, testUnidimDcmBiasEstimator error code: " << exitCode << std::endl;
    return exitCode;
  }

  exitCode = testDcmBiasEstimator(3);
  if(exitCode != 0)
  {
    std::cout << "Failed, testDcmBiasEstimator error code: " << exitCode << std::endl;
    return exitCode;
  }

  std::cout << "Succeeded" << std::endl;
  return exitCode;
}